

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

Node<QByteArray,_QNetworkAccessCache::Node_*> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QNetworkAccessCache::Node_*>_>::
findNode<QByteArray>
          (Data<QHashPrivate::Node<QByteArray,_QNetworkAccessCache::Node_*>_> *this,QByteArray *key)

{
  long lVar1;
  bool bVar2;
  Node<QByteArray,_QNetworkAccessCache::Node_*> *pNVar3;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  Bucket bucket;
  Data<QHashPrivate::Node<QByteArray,_QNetworkAccessCache::Node_*>_> *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  findBucket<QByteArray>(in_stack_ffffffffffffffe0,in_RDI);
  bVar2 = Bucket::isUnused((Bucket *)0x195edb);
  if (bVar2) {
    pNVar3 = (Node<QByteArray,_QNetworkAccessCache::Node_*> *)0x0;
  }
  else {
    pNVar3 = Bucket::node((Bucket *)0x195ef6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pNVar3;
  }
  __stack_chk_fail();
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }